

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHashedSimplePairCache.cpp
# Opt level: O3

btSimplePair * __thiscall
btHashedSimplePairCache::internalAddPair(btHashedSimplePairCache *this,int indexA,int indexB)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  int *piVar4;
  btSimplePair *ptr;
  undefined8 uVar5;
  uint uVar6;
  uint uVar7;
  btSimplePair *pbVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  
  uVar6 = indexB << 0x10 | indexA;
  uVar6 = ~(uVar6 << 0xf) + uVar6;
  uVar9 = ((int)uVar6 >> 10 ^ uVar6) * 9;
  uVar9 = (int)uVar9 >> 6 ^ uVar9;
  uVar9 = ~(uVar9 << 0xb) + uVar9;
  uVar9 = (int)uVar9 >> 0x10 ^ uVar9;
  uVar6 = (this->m_overlappingPairArray).m_capacity;
  uVar12 = (ulong)(int)(uVar6 - 1 & uVar9);
  iVar10 = (this->m_hashTable).m_data[uVar12];
  if (iVar10 != -1) {
    pbVar8 = (this->m_overlappingPairArray).m_data;
    do {
      if ((pbVar8[iVar10].m_indexA == indexA) && (pbVar8[iVar10].m_indexB == indexB)) {
        return pbVar8 + iVar10;
      }
      iVar10 = (this->m_next).m_data[iVar10];
    } while (iVar10 != -1);
  }
  uVar3 = (this->m_overlappingPairArray).m_size;
  uVar7 = uVar3;
  if (uVar3 == uVar6) {
    iVar10 = 1;
    if (uVar6 != 0) {
      iVar10 = uVar6 * 2;
    }
    uVar7 = uVar6;
    if ((int)uVar6 < iVar10) {
      if (iVar10 == 0) {
        pbVar8 = (btSimplePair *)0x0;
      }
      else {
        pbVar8 = (btSimplePair *)btAlignedAllocInternal((long)iVar10 << 4,0x10);
        uVar7 = (this->m_overlappingPairArray).m_size;
      }
      if (0 < (int)uVar7) {
        lVar11 = 0;
        do {
          puVar1 = (undefined8 *)((long)&((this->m_overlappingPairArray).m_data)->m_indexA + lVar11)
          ;
          uVar5 = puVar1[1];
          puVar2 = (undefined8 *)((long)&pbVar8->m_indexA + lVar11);
          *puVar2 = *puVar1;
          puVar2[1] = uVar5;
          lVar11 = lVar11 + 0x10;
        } while ((ulong)uVar7 << 4 != lVar11);
      }
      ptr = (this->m_overlappingPairArray).m_data;
      if ((ptr != (btSimplePair *)0x0) && ((this->m_overlappingPairArray).m_ownsMemory == true)) {
        btAlignedFreeInternal(ptr);
      }
      (this->m_overlappingPairArray).m_ownsMemory = true;
      (this->m_overlappingPairArray).m_data = pbVar8;
      (this->m_overlappingPairArray).m_capacity = iVar10;
      piVar4 = &(this->m_overlappingPairArray).m_size;
      *piVar4 = *piVar4 + 1;
      pbVar8 = pbVar8 + (int)uVar3;
      if ((int)uVar6 < iVar10) {
        growTables(this);
        uVar12 = (long)(int)uVar9 & (long)(this->m_overlappingPairArray).m_capacity - 1U;
      }
      goto LAB_00155b2a;
    }
  }
  (this->m_overlappingPairArray).m_size = uVar7 + 1;
  pbVar8 = (this->m_overlappingPairArray).m_data + (int)uVar3;
LAB_00155b2a:
  pbVar8->m_indexA = indexA;
  pbVar8->m_indexB = indexB;
  (pbVar8->field_2).m_userPointer = (void *)0x0;
  piVar4 = (this->m_hashTable).m_data;
  (this->m_next).m_data[(int)uVar3] = piVar4[uVar12];
  piVar4[uVar12] = uVar3;
  return pbVar8;
}

Assistant:

btSimplePair* btHashedSimplePairCache::internalAddPair(int indexA, int indexB)
{

	int	hash = static_cast<int>(getHash(static_cast<unsigned int>(indexA),static_cast<unsigned int>(indexB)) & (m_overlappingPairArray.capacity()-1));	// New hash value with new mask


	btSimplePair* pair = internalFindPair(indexA, indexB, hash);
	if (pair != NULL)
	{
		return pair;
	}

	int count = m_overlappingPairArray.size();
	int oldCapacity = m_overlappingPairArray.capacity();
	void* mem = &m_overlappingPairArray.expandNonInitializing();

	int newCapacity = m_overlappingPairArray.capacity();

	if (oldCapacity < newCapacity)
	{
		growTables();
		//hash with new capacity
		hash = static_cast<int>(getHash(static_cast<unsigned int>(indexA),static_cast<unsigned int>(indexB)) & (m_overlappingPairArray.capacity()-1));
	}
	
	pair = new (mem) btSimplePair(indexA,indexB);

	pair->m_userPointer = 0;
	
	m_next[count] = m_hashTable[hash];
	m_hashTable[hash] = count;

	return pair;
}